

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

QRectF * __thiscall
QGraphicsViewPrivate::mapRectToScene
          (QRectF *__return_storage_ptr__,QGraphicsViewPrivate *this,QRect *rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long in_FS_OFFSET;
  int iVar11;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar12;
  undefined1 auVar10 [16];
  bool local_70 [80];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = *(uint *)&this->field_0x300;
  if ((uVar7 & 0x20) != 0) {
    updateScroll(this);
    uVar7 = *(uint *)&this->field_0x300;
  }
  iVar5 = (int)this->scrollX;
  iVar6 = (int)this->scrollY;
  uVar1 = rect->x1;
  uVar3 = rect->y1;
  iVar11 = uVar1 + iVar5;
  auVar8._4_4_ = uVar3 + iVar6;
  uVar2 = rect->x2;
  uVar4 = rect->y2;
  iVar12 = uVar2 + iVar5;
  auVar10._4_4_ = uVar4 + iVar6;
  auVar10._8_4_ = auVar10._4_4_;
  auVar10._12_4_ = -(uint)(auVar10._4_4_ < 0);
  auVar8._8_4_ = auVar8._4_4_;
  auVar8._12_4_ = -(uint)(auVar8._4_4_ < 0);
  auVar9._8_4_ = 0xffffffff;
  auVar9._0_8_ = 0xffffffffffffffff;
  auVar9._12_4_ = 0xffffffff;
  if ((uVar7 & 0x10) == 0) {
    QTransform::inverted(local_70);
    QTransform::mapRect(__return_storage_ptr__);
  }
  else {
    __return_storage_ptr__->w =
         (double)((CONCAT44(-(uint)(iVar12 < 0),iVar12) - CONCAT44(-(uint)(iVar11 < 0),iVar11)) + 1)
    ;
    __return_storage_ptr__->h = (double)((auVar10._8_8_ - auVar8._8_8_) - auVar9._8_8_);
    __return_storage_ptr__->xp = (double)iVar11;
    __return_storage_ptr__->yp = (double)auVar8._4_4_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsViewPrivate::mapRectToScene(const QRect &rect) const
{
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();
    QRectF scrolled = QRectF(rect.translated(scrollX, scrollY));
    return identityMatrix ? scrolled : matrix.inverted().mapRect(scrolled);
}